

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

Vector<Converter::Impl::RawDeclarationVariable> * __thiscall
dxil_spv::Converter::Impl::create_bindless_heap_variable_alias_group
          (Vector<Converter::Impl::RawDeclarationVariable> *__return_storage_ptr__,Impl *this,
          BindlessInfo *base_info,Vector<RawDeclaration> *raw_decls)

{
  pointer *ppRVar1;
  RawWidth RVar2;
  RawType RVar3;
  pointer pRVar4;
  iterator __position;
  undefined1 uVar5;
  undefined2 uVar6;
  undefined4 uVar7;
  Id IVar8;
  RawDeclaration *decl;
  pointer pRVar9;
  RawDeclarationVariable var;
  BindlessInfo info;
  RawDeclarationVariable local_68;
  BindlessInfo local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ::reserve(__return_storage_ptr__,
            ((long)(raw_decls->
                   super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(raw_decls->
                   super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
  pRVar9 = (raw_decls->
           super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar4 = (raw_decls->
           super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar9 != pRVar4) {
    do {
      local_68.var_id = 0;
      local_68.declaration.vecsize = pRVar9->vecsize;
      local_68.declaration.type = pRVar9->type;
      local_68.declaration.width = pRVar9->width;
      local_58.binding = base_info->binding;
      uVar5 = base_info->type;
      uVar6 = *(undefined2 *)&base_info->field_0x2;
      uVar7 = base_info->raw_vecsize;
      local_58.raw_vecsize = uVar7;
      local_58._2_2_ = uVar6;
      local_58.kind = base_info->kind;
      local_58._9_3_ = *(undefined3 *)&base_info->field_0x9;
      local_58.format = base_info->format;
      local_58.descriptor_type = base_info->descriptor_type;
      local_58.uav_read = base_info->uav_read;
      local_58.uav_written = base_info->uav_written;
      local_58.uav_coherent = base_info->uav_coherent;
      local_58.counters = base_info->counters;
      local_58.offsets = base_info->offsets;
      local_58.aliased = base_info->aliased;
      local_58.relaxed_precision = base_info->relaxed_precision;
      local_58._27_1_ = base_info->field_0x1b;
      local_58.desc_set = base_info->desc_set;
      RVar2 = pRVar9->width;
      if (RVar2 == B8) {
        local_58.component = InternalU8;
      }
      else {
        RVar3 = pRVar9->type;
        if (RVar2 == B64) {
          local_58.component = (RVar3 == Float) * '\x03' + U64;
        }
        else if (RVar2 == B16) {
          local_58.component = (RVar3 == Float) * '\x05' + U16;
        }
        else {
          local_58.component = (RVar3 == Float) * '\x04' + U32;
        }
      }
      local_58.type = uVar5;
      local_58.raw_vecsize = pRVar9->vecsize;
      IVar8 = create_bindless_heap_variable(this,&local_58);
      local_68.var_id = IVar8;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<dxil_spv::Converter::Impl::RawDeclarationVariable,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>>
        ::_M_realloc_insert<dxil_spv::Converter::Impl::RawDeclarationVariable_const&>
                  ((vector<dxil_spv::Converter::Impl::RawDeclarationVariable,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>>
                    *)__return_storage_ptr__,__position,&local_68);
      }
      else {
        ((__position._M_current)->declaration).type = local_68.declaration.type;
        ((__position._M_current)->declaration).width = local_68.declaration.width;
        *(undefined8 *)&((__position._M_current)->declaration).vecsize = local_68._8_8_;
        ppRVar1 = &(__return_storage_ptr__->
                   super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppRVar1 = *ppRVar1 + 1;
      }
      pRVar9 = pRVar9 + 1;
    } while (pRVar9 != pRVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<Converter::Impl::RawDeclarationVariable>
Converter::Impl::create_bindless_heap_variable_alias_group(const BindlessInfo &base_info,
                                                           const Vector<RawDeclaration> &raw_decls)
{
	Vector<RawDeclarationVariable> decls;
	decls.reserve(raw_decls.size());

	for (auto &decl : raw_decls)
	{
		RawDeclarationVariable var = {};
		var.declaration = decl;

		auto info = base_info;
		info.component = raw_width_to_component_type(decl.type, decl.width);
		info.raw_vecsize = decl.vecsize;
		var.var_id = create_bindless_heap_variable(info);
		decls.push_back(var);
	}

	return decls;
}